

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O1

void __thiscall ncnn::BatchNorm::BatchNorm(BatchNorm *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__BatchNorm_0061fc40;
  (this->b_data).cstep = 0;
  (this->slope_data).data = (void *)0x0;
  (this->slope_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->slope_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->slope_data).elemsize + 4) = 0;
  (this->slope_data).allocator = (Allocator *)0x0;
  (this->slope_data).dims = 0;
  (this->slope_data).w = 0;
  (this->slope_data).w = 0;
  (this->slope_data).h = 0;
  (this->slope_data).d = 0;
  (this->slope_data).c = 0;
  (this->slope_data).cstep = 0;
  (this->mean_data).data = (void *)0x0;
  (this->mean_data).refcount = (int *)0x0;
  (this->mean_data).elemsize = 0;
  (this->mean_data).elempack = 0;
  (this->mean_data).allocator = (Allocator *)0x0;
  (this->mean_data).dims = 0;
  (this->mean_data).w = 0;
  (this->mean_data).w = 0;
  (this->mean_data).h = 0;
  (this->mean_data).d = 0;
  (this->mean_data).c = 0;
  (this->mean_data).cstep = 0;
  (this->var_data).data = (void *)0x0;
  (this->var_data).refcount = (int *)0x0;
  (this->var_data).elemsize = 0;
  (this->var_data).elempack = 0;
  (this->var_data).allocator = (Allocator *)0x0;
  (this->var_data).dims = 0;
  (this->var_data).w = 0;
  (this->var_data).w = 0;
  (this->var_data).h = 0;
  (this->var_data).d = 0;
  (this->var_data).c = 0;
  (this->var_data).cstep = 0;
  (this->bias_data).data = (void *)0x0;
  (this->bias_data).refcount = (int *)0x0;
  (this->bias_data).elemsize = 0;
  (this->bias_data).elempack = 0;
  (this->bias_data).w = 0;
  (this->bias_data).h = 0;
  (this->bias_data).d = 0;
  (this->bias_data).c = 0;
  (this->bias_data).allocator = (Allocator *)0x0;
  (this->bias_data).dims = 0;
  (this->bias_data).w = 0;
  (this->a_data).elempack = 0;
  (this->a_data).refcount = (int *)0x0;
  (this->a_data).elemsize = 0;
  (this->bias_data).cstep = 0;
  (this->a_data).data = (void *)0x0;
  (this->a_data).w = 0;
  (this->a_data).h = 0;
  (this->a_data).d = 0;
  (this->a_data).c = 0;
  (this->a_data).allocator = (Allocator *)0x0;
  (this->a_data).dims = 0;
  (this->a_data).w = 0;
  (this->b_data).elempack = 0;
  (this->b_data).refcount = (int *)0x0;
  (this->b_data).elemsize = 0;
  (this->a_data).cstep = 0;
  (this->b_data).data = (void *)0x0;
  (this->b_data).w = 0;
  (this->b_data).h = 0;
  (this->b_data).d = 0;
  (this->b_data).c = 0;
  (this->b_data).allocator = (Allocator *)0x0;
  (this->b_data).dims = 0;
  (this->b_data).w = 0;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = true;
  return;
}

Assistant:

BatchNorm::BatchNorm()
{
    one_blob_only = true;
    support_inplace = true;
}